

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

void __thiscall
QHttp2ProtocolHandler::finishStream
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,ConnectionType connectionType)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ContextType *object;
  QHttpNetworkRequestPrivate *pQVar4;
  QDebug QVar5;
  int iVar6;
  QLoggingCategory *pQVar7;
  long lVar8;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebug local_80;
  QHttp2Stream *local_78;
  QArrayData *local_70;
  undefined8 local_68;
  QMetaMethodReturnArgument local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = stream;
  if (stream->m_state != Closed) {
    QHttp2Stream::sendRST_STREAM((QHttp2Stream *)stream,CANCEL);
  }
  QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
  tryEmplace_impl<QHttp2Stream*const&>
            ((TryEmplaceResult *)&local_58,
             (QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)(this + 0x50)
             ,&local_78);
  lVar2 = *(long *)(CONCAT44(local_58.metaType._4_4_,local_58.metaType._0_4_) + 0x20);
  lVar8 = (CONCAT44(local_58.name._4_4_,(uint)local_58.name) >> 7) * 0x90;
  lVar3 = *(long *)(lVar2 + 0x80 + lVar8);
  bVar1 = *(byte *)((ulong)((uint)local_58.name & 0x7f) + lVar2 + lVar8);
  object = *(ContextType **)(lVar3 + 0x18 + (ulong)bVar1 * 0x20);
  if (object != (ContextType *)0x0) {
    iVar6 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)object);
    if ((iVar6 == 0x197) || (iVar6 == 0x191)) {
      handleAuthorization(this,local_78);
    }
    else {
      QObject::disconnect(&object->super_QObject,(char *)0x0,(QObject *)this,(char *)0x0);
      this_00 = (QSharedDataPointer<QHttpNetworkRequestPrivate> *)
                (lVar3 + (ulong)bVar1 * 0x20 + 0x10);
      pQVar4 = (this_00->d).ptr;
      if ((pQVar4 != (QHttpNetworkRequestPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar4->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.
            super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value !=
          (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(this_00);
      }
      if (((this_00->d).ptr)->needResendWithCredentials == false) {
        if (connectionType == DirectConnection) {
          QHttpNetworkReply::finished((QHttpNetworkReply *)object);
        }
        else {
          local_70 = (QArrayData *)QHttpNetworkReply::finished;
          local_68 = 0;
          local_58.metaType._0_4_ = 0x2cf250;
          local_58.metaType._4_4_ = 0;
          local_58.name._0_4_ = 0;
          local_58.name._4_4_ = 0;
          local_58.data._0_4_ = 0;
          local_58.data._4_4_ = 0;
          QMetaObject::invokeMethodCallableHelper<void(QHttpNetworkReply::*)()>
                    (object,(offset_in_QHttpNetworkReply_to_subr *)&local_70,connectionType,
                     &local_58);
        }
      }
    }
    if ((iVar6 == 0x191) || (iVar6 == 0x197)) goto LAB_001f8085;
  }
  pQVar7 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar7->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar7->name;
    local_58.metaType._0_4_ = 2;
    local_58.metaType._4_4_ = 0;
    local_58.name._0_4_ = 0;
    local_58.name._4_4_ = 0;
    local_58.data._0_4_ = 0;
    local_58.data._4_4_ = 0;
    QMessageLogger::debug();
    QVar5.stream = local_80.stream;
    QVar9.m_data = &DAT_00000006;
    QVar9.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)&local_70);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_80.stream,local_78->m_streamID);
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    QVar5.stream = local_80.stream;
    QVar10.m_data = &DAT_00000006;
    QVar10.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)&local_70);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    QDebug::~QDebug(&local_80);
  }
  QObject::deleteLater();
LAB_001f8085:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::finishStream(QHttp2Stream *stream, Qt::ConnectionType connectionType)
{
    if (stream->state() != QHttp2Stream::State::Closed)
        stream->sendRST_STREAM(CANCEL);

    auto &pair = requestReplyPairs[stream];
    auto *httpReply = pair.second;
    if (httpReply) {
        int statusCode = httpReply->statusCode();
        if (statusCode == 401 || statusCode == 407) {
            // handleAuthorization will either re-send the request or
            // finishWithError. In either case we don't want to emit finished
            // here.
            handleAuthorization(stream);
            return;
        }

        httpReply->disconnect(this);

        if (!pair.first.d->needResendWithCredentials) {
            if (connectionType == Qt::DirectConnection)
                emit httpReply->finished();
            else
                QMetaObject::invokeMethod(httpReply, &QHttpNetworkReply::finished, connectionType);
        }
    }

    qCDebug(QT_HTTP2) << "stream" << stream->streamID() << "closed";
    stream->deleteLater();
}